

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_end_word(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).cursor == (el->el_line).lastchar) {
    el_local._7_1_ = '\x06';
  }
  else {
    pwVar1 = cv__endword((el->el_line).cursor,(el->el_line).lastchar,(el->el_state).argument,
                         cv__isword);
    (el->el_line).cursor = pwVar1;
    if ((el->el_chared).c_vcmd.action == L'\0') {
      el_local._7_1_ = '\x05';
    }
    else {
      (el->el_line).cursor = (el->el_line).cursor + 1;
      cv_delfini(el);
      el_local._7_1_ = '\x04';
    }
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_end_word(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor == el->el_line.lastchar)
		return CC_ERROR;

	el->el_line.cursor = cv__endword(el->el_line.cursor,
	    el->el_line.lastchar, el->el_state.argument, cv__isword);

	if (el->el_chared.c_vcmd.action != NOP) {
		el->el_line.cursor++;
		cv_delfini(el);
		return CC_REFRESH;
	}
	return CC_CURSOR;
}